

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.h
# Opt level: O0

bool GCPtr<symbols::RangeObject>::collect(void)

{
  bool bVar1;
  pointer pGVar2;
  reference __filename;
  _Self local_38;
  _List_node_base *local_30;
  _Self local_28;
  _List_node_base *local_20;
  _List_iterator<GCInfo<symbols::RangeObject>_> local_18;
  iterator p;
  bool memfreed;
  
  p._M_node._7_1_ = 0;
  std::_List_iterator<GCInfo<symbols::RangeObject>_>::_List_iterator(&local_18);
  do {
    local_20 = (_List_node_base *)
               std::__cxx11::
               list<GCInfo<symbols::RangeObject>,_std::allocator<GCInfo<symbols::RangeObject>_>_>::
               begin(&gclist_abi_cxx11_);
    local_18._M_node = local_20;
    while( true ) {
      local_28._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<GCInfo<symbols::RangeObject>,_std::allocator<GCInfo<symbols::RangeObject>_>_>::end
                     (&gclist_abi_cxx11_);
      bVar1 = std::operator==(&local_18,&local_28);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      pGVar2 = std::_List_iterator<GCInfo<symbols::RangeObject>_>::operator->(&local_18);
      if (pGVar2->refcount == 0) {
        p._M_node._7_1_ = 1;
        __filename = std::_List_iterator<GCInfo<symbols::RangeObject>_>::operator*(&local_18);
        std::__cxx11::
        list<GCInfo<symbols::RangeObject>,_std::allocator<GCInfo<symbols::RangeObject>_>_>::remove
                  (&gclist_abi_cxx11_,(char *)__filename);
        pGVar2 = std::_List_iterator<GCInfo<symbols::RangeObject>_>::operator->(&local_18);
        if (pGVar2->memPtr != (RangeObject *)0x0) {
          pGVar2 = std::_List_iterator<GCInfo<symbols::RangeObject>_>::operator->(&local_18);
          if (pGVar2->memPtr != (RangeObject *)0x0) {
            (**(code **)(*(long *)pGVar2->memPtr + 0x10))();
          }
        }
        break;
      }
      local_30 = (_List_node_base *)
                 std::_List_iterator<GCInfo<symbols::RangeObject>_>::operator++(&local_18,0);
    }
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<GCInfo<symbols::RangeObject>,_std::allocator<GCInfo<symbols::RangeObject>_>_>::end
                   (&gclist_abi_cxx11_);
    bVar1 = std::operator==(&local_18,&local_38);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return (bool)(p._M_node._7_1_ & 1);
    }
  } while( true );
}

Assistant:

bool GCPtr<T>::collect() {
    bool memfreed = false;
    #ifdef DISPLAY
        cout << "Before garbage collection for ";
        showlist();
    #endif

    typename list<GCInfo<T>>::iterator p;

    do{
        // Scan gclist looking for unreferenced pointers.
        for(p = gclist.begin(); p != gclist.end(); p++){
            // If in-use, skip.
            if(p->refcount > 0) continue;
            memfreed = true;
            // Remove unused entry from gclist.
            gclist.remove(*p);
            // Free memory unless the GCPtr is null
            if(p->memPtr){

                #ifdef DISPLAY
                cout << "Deleting: " << p->memPtr << "\n";
                #endif
                delete  p->memPtr; // delete single element
            }
            // Restart the search
            break;
        }
    }while( p != gclist.end());
    #ifdef DISPLAY
    cout << "After garbage collection for ";
    showlist();
    #endif
    return memfreed;
}